

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * columnName(sqlite3_stmt *pStmt,int N,_func_void_ptr_Mem_ptr *xFunc,int useType)

{
  ushort uVar1;
  sqlite3 *db;
  void *pvVar2;
  
  uVar1 = *(ushort *)(pStmt + 0xbc);
  if ((uint)N < (uint)uVar1) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    pvVar2 = (*xFunc)((Mem *)((ulong)((uint)uVar1 * useType + N) * 0x38 + *(long *)(pStmt + 0x80)));
    if (db->mallocFailed != '\0') {
      sqlite3OomClear(db);
      pvVar2 = (void *)0x0;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

static const void *columnName(
  sqlite3_stmt *pStmt,
  int N,
  const void *(*xFunc)(Mem*),
  int useType
){
  const void *ret;
  Vdbe *p;
  int n;
  sqlite3 *db;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  ret = 0;
  p = (Vdbe *)pStmt;
  db = p->db;
  assert( db!=0 );
  n = sqlite3_column_count(pStmt);
  if( N<n && N>=0 ){
    N += useType*n;
    sqlite3_mutex_enter(db->mutex);
    assert( db->mallocFailed==0 );
    ret = xFunc(&p->aColName[N]);
     /* A malloc may have failed inside of the xFunc() call. If this
    ** is the case, clear the mallocFailed flag and return NULL.
    */
    if( db->mallocFailed ){
      sqlite3OomClear(db);
      ret = 0;
    }
    sqlite3_mutex_leave(db->mutex);
  }
  return ret;
}